

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::traceIn(Parser *this,string *rname)

{
  ostream *poVar1;
  Token *pTVar2;
  ParserInputState *pPVar3;
  ostream *this_00;
  string *in_RSI;
  char *pcVar4;
  long *in_RDI;
  RefCount<Token> local_38;
  string local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  poVar1 = std::operator<<((ostream *)&std::cout,"enter ");
  poVar1 = std::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1,"; LA(1)==");
  (**(code **)(*in_RDI + 0x28))(&local_38,in_RDI,1);
  pTVar2 = RefCount<Token>::operator->(&local_38);
  (*pTVar2->_vptr_Token[2])(local_30);
  poVar1 = std::operator<<(poVar1,local_30);
  pPVar3 = RefCount<ParserInputState>::operator->((RefCount<ParserInputState> *)(in_RDI + 1));
  pcVar4 = "";
  if (0 < pPVar3->guessing) {
    pcVar4 = " [guessing]";
  }
  this_00 = std::operator<<(poVar1,pcVar4);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  RefCount<Token>::~RefCount((RefCount<Token> *)poVar1);
  return;
}

Assistant:

void Parser::traceIn(const std::string& rname)
{
	std::cout << "enter " << rname << "; LA(1)==" << LT(1)->getText() <<
			((inputState->guessing>0)?" [guessing]":"") << std::endl;
}